

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QAbstractEventDispatcher::TimerInfo>::reallocate
          (QPodArrayOps<QAbstractEventDispatcher::TimerInfo> *this,qsizetype alloc,
          AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  TimerInfo *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QAbstractEventDispatcher::TimerInfo>_*,_QAbstractEventDispatcher::TimerInfo_*>
  pVar2;
  pair<QTypedArrayData<QAbstractEventDispatcher::TimerInfo>_*,_QAbstractEventDispatcher::TimerInfo_*>
  pair;
  TimerInfo *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QAbstractEventDispatcher::TimerInfo>::reallocateUnaligned
                    ((QTypedArrayData<QAbstractEventDispatcher::TimerInfo> *)&DAT_aaaaaaaaaaaaaaaa,
                     in_RDI,in_RSI,in_EDX);
  local_10 = pVar2.second;
  if (local_10 == (TimerInfo *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      qBadAlloc();
    }
  }
  else {
    *(QTypedArrayData<QAbstractEventDispatcher::TimerInfo> **)in_RDI = pVar2.first;
    *(TimerInfo **)&in_RDI->timerType = local_10;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }